

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O2

void __thiscall
UnitUtilTest_timesOverflowsEdge_Test::~UnitUtilTest_timesOverflowsEdge_Test
          (UnitUtilTest_timesOverflowsEdge_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UnitUtilTest, timesOverflowsEdge)
{
    const auto m1 = m;
    const auto m7 = m * m * m * m * m * m * m;
    const auto im8 = (one / m7) / m;
    const auto im1 = one / m1;
    // At lower or upper bound:
    // unchanged exponent
    EXPECT_FALSE(times_overflows(m7, one));
    EXPECT_FALSE(times_overflows(one, m7));
    EXPECT_FALSE(times_overflows(im8, one));
    EXPECT_FALSE(times_overflows(one, im8));
    // change by 1 *away* from bound
    EXPECT_FALSE(times_overflows(m7, im1));
    EXPECT_FALSE(times_overflows(im1, m7));
    EXPECT_FALSE(times_overflows(im8, m1));
    EXPECT_FALSE(times_overflows(m1, im8));
    // change by 1 *towards* from bound => overflow or underflow
    if (units::detail::bitwidth::base_size == 4) {
        EXPECT_TRUE(times_overflows(m7, m1));
        EXPECT_TRUE(times_overflows(m1, m7));
        EXPECT_TRUE(times_overflows(im8, im1));
        EXPECT_TRUE(times_overflows(im1, im8));
    } else {
        EXPECT_FALSE(times_overflows(m7, m1));
        EXPECT_FALSE(times_overflows(m1, m7));
        EXPECT_FALSE(times_overflows(im8, im1));
        EXPECT_FALSE(times_overflows(im1, im8));
    }
}